

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_f39c41::PathSimplifier::splitLineAt
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,BVHNode *node,
          quint32 pointIndex,bool processAgain)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  quint32 qVar4;
  QPoint *pQVar5;
  ElementBlock *pEVar6;
  QPoint QVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Element *pEVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  ElementBlock *pEVar14;
  long lVar15;
  Element *pEVar16;
  Node *pNVar17;
  Element *pEVar18;
  int iVar19;
  Element *pEVar20;
  bool bVar21;
  
  pEVar18 = (node->field_3).element;
  uVar1 = pEVar18->indices[0];
  uVar2 = pEVar18->indices[1];
  pQVar5 = this->m_points->buffer;
  iVar3 = pQVar5[pointIndex].xp.m_i;
  iVar19 = pQVar5[pointIndex].yp.m_i;
  if (((pQVar5[uVar1].xp.m_i == iVar3) && (pQVar5[uVar1].yp.m_i == iVar19)) ||
     ((pQVar5[uVar2].xp.m_i == iVar3 && (pQVar5[uVar2].yp.m_i == iVar19)))) {
    bVar21 = false;
  }
  else {
    if (processAgain) {
      pEVar18->field_0x39 = pEVar18->field_0x39 & 0xfe;
      pEVar18 = (node->field_3).element;
    }
    pEVar6 = (this->m_elementAllocator).blocks;
    iVar3 = pEVar6->firstFree;
    iVar19 = pEVar6->blockSize;
    if (iVar3 < iVar19) {
      pEVar6->firstFree = iVar3 + 1;
      pEVar14 = (ElementBlock *)&pEVar6->elements[(long)iVar3 + -1].field_5;
    }
    else {
      pEVar14 = (ElementBlock *)malloc((long)iVar19 << 6 | 0x10);
      (this->m_elementAllocator).blocks = pEVar14;
      pEVar14->blockSize = iVar19;
      ((anon_union_8_2_075f57e8_for_Element_5 *)&pEVar14->next)->bvhNode = (Node *)pEVar6;
      pEVar14->firstFree = 1;
    }
    pEVar20 = pEVar14->elements;
    uVar8 = *(undefined8 *)pEVar18->indices;
    uVar9 = *(undefined8 *)(pEVar18->indices + 2);
    pEVar16 = pEVar18->next;
    pEVar10 = pEVar18->previous;
    iVar3 = pEVar18->winding;
    uVar13 = *(undefined4 *)&pEVar18->field_0x2c;
    uVar11 = *(undefined8 *)((long)&pEVar18->winding + 2);
    uVar12 = *(undefined8 *)((long)&pEVar18->field_5 + 2);
    pEVar20->middle = pEVar18->middle;
    *(undefined8 *)pEVar14->elements[0].indices = uVar8;
    *(undefined8 *)((long)&pEVar14->elements[0].winding + 2) = uVar11;
    *(undefined8 *)((long)&pEVar14->elements[0].field_5 + 2) = uVar12;
    pEVar14->elements[0].previous = pEVar10;
    pEVar14->elements[0].winding = iVar3;
    *(undefined4 *)&pEVar14->elements[0].field_0x2c = uVar13;
    *(undefined8 *)(pEVar14->elements[0].indices + 2) = uVar9;
    pEVar14->elements[0].next = pEVar16;
    pEVar14->elements[0].indices[0] = pointIndex;
    pEVar18->indices[1] = pointIndex;
    (pEVar18->middle).xp.m_i = pQVar5[pointIndex].xp.m_i + pQVar5[uVar1].xp.m_i >> 1;
    (pEVar18->middle).yp.m_i = pQVar5[pointIndex].yp.m_i + pQVar5[uVar1].yp.m_i >> 1;
    (pEVar20->middle).xp.m_i = pQVar5[pointIndex].xp.m_i + pQVar5[uVar2].xp.m_i >> 1;
    pEVar14->elements[0].middle.yp.m_i = pQVar5[pointIndex].yp.m_i + pQVar5[uVar2].yp.m_i >> 1;
    QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve
              (&this->m_elements,(this->m_elements).siz + 1);
    lVar15 = (this->m_elements).siz;
    (this->m_elements).buffer[lVar15] = pEVar20;
    (this->m_elements).siz = lVar15 + 1;
    iVar3 = (this->m_bvh).blockSize;
    iVar19 = (this->m_bvh).firstFree;
    if (iVar19 < iVar3) {
      lVar15 = (long)iVar19;
      iVar19 = iVar19 + 1;
      (this->m_bvh).firstFree = iVar19;
      pEVar16 = (Element *)((this->m_bvh).nodeBlock + lVar15);
    }
    else {
      pEVar16 = (Element *)operator_new(0x28);
      *(undefined8 *)&(pEVar16->middle).yp = 0;
      pEVar16->indices[1] = 0;
      pEVar16->indices[2] = 0;
    }
    if (iVar19 < iVar3) {
      (this->m_bvh).firstFree = iVar19 + 1;
      pNVar17 = (this->m_bvh).nodeBlock + iVar19;
    }
    else {
      pNVar17 = (Node *)operator_new(0x28);
      (pNVar17->minimum).xp = 0;
      (pNVar17->minimum).yp = 0;
      (pNVar17->maximum).xp = 0;
      (pNVar17->maximum).yp = 0;
    }
    pNVar17->type = Leaf;
    (pEVar16->middle).xp.m_i = 0;
    pEVar16->next = pEVar18;
    (pNVar17->field_3).element = pEVar20;
    QVar7 = node->minimum;
    pNVar17->minimum = QVar7;
    *(QPoint *)&(pEVar16->middle).yp = QVar7;
    QVar7 = node->maximum;
    pNVar17->maximum = QVar7;
    *(QPoint *)(pEVar16->indices + 1) = QVar7;
    iVar19 = pQVar5[uVar1].xp.m_i;
    iVar3 = pQVar5[uVar2].xp.m_i;
    qVar4 = pQVar5[pointIndex].xp.m_i;
    (&pNVar17->minimum)[iVar3 <= iVar19].xp.m_i = qVar4;
    pEVar16->indices[(ulong)(iVar19 < iVar3) * 2 + -1] = qVar4;
    iVar19 = pQVar5[uVar1].yp.m_i;
    iVar3 = pQVar5[uVar2].yp.m_i;
    qVar4 = pQVar5[pointIndex].yp.m_i;
    (&pNVar17->minimum)[iVar3 <= iVar19].yp.m_i = qVar4;
    pEVar16->indices[(ulong)(iVar19 < iVar3) * 2] = qVar4;
    (pEVar16->next->field_5).edgeNode = (Node *)pEVar16;
    *(Node **)&(pNVar17->field_3).left[1].minimum.yp = pNVar17;
    node->type = Split;
    (node->field_3).element = pEVar16;
    node->right = pNVar17;
    bVar21 = true;
    if ((pEVar18->field_0x39 & 1) == 0) {
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve
                (elements,elements->siz + 1);
      lVar15 = elements->siz;
      elements->buffer[lVar15] = pEVar16->next;
      elements->siz = lVar15 + 1;
      QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::reserve(elements,lVar15 + 2);
      lVar15 = elements->siz;
      *(anon_union_8_2_70fb368a_for_Node_4 *)(elements->buffer + lVar15) = pNVar17->field_3;
      elements->siz = lVar15 + 1;
    }
  }
  return bVar21;
}

Assistant:

bool PathSimplifier::splitLineAt(QDataBuffer<Element *> &elements, BVHNode *node,
                                 quint32 pointIndex, bool processAgain)
{
    Q_ASSERT(node->type == BVHNode::Leaf);
    Element *element = node->element;
    Q_ASSERT(element->degree == Element::Line);
    const QPoint &u = m_points->at(element->indices[0]);
    const QPoint &v = m_points->at(element->indices[1]);
    const QPoint &p = m_points->at(pointIndex);
    if (u == p || v == p)
        return false; // No split needed.

    if (processAgain)
        element->processed = false; // Needs to be processed again.

    Element *first = node->element;
    Element *second = m_elementAllocator.newElement();
    *second = *first;
    first->indices[1] = second->indices[0] = pointIndex;
    first->middle.rx() = (u.x() + p.x()) >> 1;
    first->middle.ry() = (u.y() + p.y()) >> 1;
    second->middle.rx() = (v.x() + p.x()) >> 1;
    second->middle.ry() = (v.y() + p.y()) >> 1;
    m_elements.add(second);

    BVHNode *left = m_bvh.newNode();
    BVHNode *right = m_bvh.newNode();
    left->type = right->type = BVHNode::Leaf;
    left->element = first;
    right->element = second;
    left->minimum = right->minimum = node->minimum;
    left->maximum = right->maximum = node->maximum;
    if (u.x() < v.x())
        left->maximum.rx() = right->minimum.rx() = p.x();
    else
        left->minimum.rx() = right->maximum.rx() = p.x();
    if (u.y() < v.y())
        left->maximum.ry() = right->minimum.ry() = p.y();
    else
        left->minimum.ry() = right->maximum.ry() = p.y();
    left->element->bvhNode = left;
    right->element->bvhNode = right;

    node->type = BVHNode::Split;
    node->left = left;
    node->right = right;

    if (!first->processed) {
        elements.add(left->element);
        elements.add(right->element);
    }
    return true;
}